

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::StartGroup(BasicReporter *this,string *groupName)

{
  SpanInfo *in_RDI;
  SpanInfo *this_00;
  SpanInfo local_38;
  
  this_00 = &local_38;
  SpanInfo::SpanInfo(this_00,&in_RDI->name);
  SpanInfo::operator=(this_00,in_RDI);
  SpanInfo::~SpanInfo((SpanInfo *)0x1a7389);
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_groupSpan = groupName;
        }